

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O1

Index wasm::Bits::getMaxBits<wasm::OptimizeInstructions>
                (Expression *curr,OptimizeInstructions *localInfoProvider)

{
  undefined1 uVar1;
  Id IVar2;
  ulong uVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  Index IVar7;
  Index IVar8;
  uint uVar9;
  Expression *pEVar10;
  Index IVar11;
  anon_union_16_5_9943fe1e_for_Literal_0 local_48;
  long local_38;
  
  IVar2 = curr->_id;
  IVar11 = 1;
  if ((int)IVar2 < 0x2c) {
    if (IVar2 == UnaryId) {
      bVar5 = Unary::isRelational((Unary *)curr);
    }
    else {
      if (IVar2 != BinaryId) {
        if (IVar2 == RefIsNullId) {
          return 1;
        }
        goto LAB_008004cd;
      }
      bVar5 = Binary::isRelational((Binary *)curr);
    }
LAB_008004c5:
    if (bVar5 != false) {
      return 1;
    }
  }
  else {
    if (IVar2 == RefEqId) {
      return 1;
    }
    if (IVar2 == RefTestId) {
      return 1;
    }
    if (IVar2 == StringEqId) {
      bVar5 = curr[1]._id == InvalidId;
      goto LAB_008004c5;
    }
  }
LAB_008004cd:
  IVar2 = curr->_id;
  if (IVar2 == ConstId) {
    uVar3 = (curr->type).id;
    if (6 < uVar3) goto LAB_00800b67;
    iVar6 = (int)uVar3;
    if (iVar6 == 3) {
      Literal::countLeadingZeroes((Literal *)&local_48.func,(Literal *)(curr + 1));
      if (local_38 != 3) goto LAB_00800b9e;
      iVar6 = 0x40;
    }
    else {
      if (iVar6 != 2) {
        handle_unreachable("invalid type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                           ,0x8b);
      }
      Literal::countLeadingZeroes((Literal *)&local_48.func,(Literal *)(curr + 1));
      if (local_38 != 2) goto LAB_00800bbd;
      iVar6 = 0x20;
    }
    IVar11 = iVar6 - local_48._0_4_;
    Literal::~Literal((Literal *)&local_48.func);
    goto switchD_008005c0_caseD_1;
  }
  if (curr == (Expression *)0x0 || IVar2 != BinaryId) {
    if (curr == (Expression *)0x0 || IVar2 != UnaryId) {
      if (curr == (Expression *)0x0 || IVar2 != LocalSetId) {
        if (curr != (Expression *)0x0 && IVar2 == LocalGetId) {
          if (localInfoProvider == (OptimizeInstructions *)0x0) {
            __assert_fail("localInfoProvider",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                          ,0x1a3,
                          "Index wasm::Bits::getMaxBits(Expression *, LocalInfoProvider *) [LocalInfoProvider = wasm::OptimizeInstructions]"
                         );
          }
          IVar11 = (localInfoProvider->localInfo).
                   super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>._M_impl.
                   super__Vector_impl_data._M_start[curr[1]._id].maxBits;
          goto LAB_00800696;
        }
        bVar5 = true;
        IVar11 = 1;
        if ((curr != (Expression *)0x0 && IVar2 == LoadId) &&
           ((local_48.i64 = (curr->type).id, 5 < local_48.func.super_IString.str._M_len ||
            ((0x32UL >> (local_48.func.super_IString.str._M_len & 0x3f) & 1) == 0)))) {
          uVar1 = (undefined1)curr[1]._id;
          IVar11 = (Index)(byte)uVar1;
          uVar9 = wasm::Type::getByteSize((Type *)&local_48.func);
          if (((byte)uVar1 < uVar9) &&
             (IVar11 = (uint)(byte)uVar1, *(byte *)((long)&curr[1]._id + 1) == 0)) {
            IVar11 = (uint)(byte)(char)curr[1]._id << 3;
            goto LAB_00800696;
          }
        }
      }
      else {
        IVar11 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)curr[1].type.id,localInfoProvider);
LAB_00800696:
        bVar5 = false;
      }
      if (bVar5) goto switchD_00800635_caseD_6;
      goto LAB_00800af5;
    }
    switch(curr[1]._id) {
    case InvalidId:
    case IfId:
    case BreakId:
      IVar11 = 6;
      break;
    case BlockId:
    case LoopId:
    case SwitchId:
      IVar11 = 7;
      break;
    case CallId:
    case CallIndirectId:
    case LocalGetId:
    case LocalSetId:
    case GlobalGetId:
    case GlobalSetId:
    case LoadId:
    case StoreId:
    case ConstId:
    case UnaryId:
    case BinaryId:
    case SelectId:
    case DropId:
    case ReturnId:
switchD_00800635_caseD_6:
      bVar5 = true;
      goto LAB_00800af7;
    case MemorySizeId:
    case MemoryGrowId:
      handle_unreachable("relationals handled before",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                         ,0x182);
    case NopId:
switchD_00800635_caseD_16:
      IVar7 = getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      bVar5 = IVar7 < 0x20;
      goto LAB_00800ad4;
    case UnreachableId:
    case AtomicRMWId:
      IVar7 = getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      bVar5 = IVar7 < 0x20;
      goto LAB_00800aeb;
    default:
      switch(curr[1]._id) {
      case TableSizeId:
        IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar5 = IVar7 < 8;
        goto LAB_00800aeb;
      case TableGrowId:
        IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar5 = IVar7 < 0x10;
LAB_00800aeb:
        IVar11 = 0x20;
        goto LAB_00800af1;
      case TryId:
        IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar5 = IVar7 < 8;
        break;
      case ThrowId:
        IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar5 = IVar7 < 0x10;
        break;
      case RethrowId:
        goto switchD_00800635_caseD_16;
      default:
        goto switchD_00800635_caseD_6;
      }
LAB_00800ad4:
      IVar11 = 0x40;
LAB_00800af1:
      if (bVar5) {
        IVar11 = IVar7;
      }
    }
LAB_00800af5:
    bVar5 = false;
LAB_00800af7:
    if (!bVar5) goto switchD_008005c0_caseD_1;
switchD_008005c0_caseD_32:
    bVar5 = true;
    goto LAB_00800b03;
  }
  IVar11 = 0x20;
  switch(curr[1]._id) {
  case InvalidId:
    IVar11 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    IVar7 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    if (IVar7 < IVar11) {
      IVar7 = IVar11;
    }
    IVar7 = IVar7 + 1;
    goto LAB_0080099c;
  case BlockId:
  case StoreId:
  case ConstId:
    break;
  case IfId:
    IVar11 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    IVar7 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider);
LAB_00800999:
    IVar7 = IVar7 + IVar11;
LAB_0080099c:
    bVar5 = IVar7 < 0x20;
    IVar11 = 0x20;
    goto LAB_00800a71;
  case LoopId:
    pEVar10 = *(Expression **)(curr + 2);
    if ((pEVar10->_id == ConstId) &&
       (IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar7 != 0x20)) {
      if (*(long *)(pEVar10 + 2) != 2) {
LAB_00800bbd:
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x118,"int32_t wasm::Literal::geti32() const");
      }
      if (-1 < (int)pEVar10[1]._id) {
LAB_008009e6:
        bVar5 = false;
        IVar11 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                           (pEVar10,(DummyLocalInfoProvider *)0x0);
        iVar6 = -1;
        if (-1 < (int)(IVar7 - IVar11)) {
          iVar6 = IVar7 - IVar11;
        }
        IVar11 = iVar6 + 1;
        goto LAB_00800b03;
      }
    }
    break;
  case BreakId:
  case SIMDExtractId:
    IVar11 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    if ((*(Expression **)(curr + 2))->_id != ConstId) break;
    bVar5 = false;
    IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                      (*(Expression **)(curr + 2),(DummyLocalInfoProvider *)0x0);
    iVar6 = -1;
    if (-1 < (int)(IVar11 - IVar7)) {
      iVar6 = IVar11 - IVar7;
    }
    IVar11 = iVar6 + 1;
    goto LAB_00800b03;
  case SwitchId:
    piVar4 = *(int **)(curr + 2);
    if ((*piVar4 != 0xe) ||
       (IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar7 == 0x20)) break;
    if (*(long *)(piVar4 + 8) != 2) goto LAB_00800bbd;
    uVar9 = ceilLog2(piVar4[4]);
LAB_00800881:
    if (uVar9 < IVar7) {
      IVar7 = uVar9;
    }
LAB_00800aaf:
    bVar5 = false;
    IVar11 = IVar7;
    goto LAB_00800b03;
  case CallId:
    piVar4 = *(int **)(curr + 2);
    if (*piVar4 == 0xe) {
      IVar11 = getMaxBits<wasm::OptimizeInstructions>
                         ((Expression *)curr[1].type.id,localInfoProvider);
      if (*(long *)(piVar4 + 8) != 2) goto LAB_00800bbd;
      IVar7 = ceilLog2(piVar4[4]);
      goto LAB_0080071f;
    }
    break;
  case CallIndirectId:
  case SIMDTernaryId:
    IVar11 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    IVar7 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    goto LAB_0080071f;
  case LocalGetId:
  case LocalSetId:
  case SIMDShiftId:
  case SIMDLoadId:
    IVar7 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider);
    IVar11 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    if (IVar11 < IVar7) {
      IVar11 = IVar7;
    }
    break;
  case GlobalGetId:
    pEVar10 = *(Expression **)(curr + 2);
    if (pEVar10->_id == ConstId) {
      IVar11 = getMaxBits<wasm::OptimizeInstructions>
                         ((Expression *)curr[1].type.id,localInfoProvider);
      IVar7 = getEffectiveShifts(pEVar10);
      goto LAB_00800999;
    }
    break;
  case GlobalSetId:
    pEVar10 = *(Expression **)(curr + 2);
    if (pEVar10->_id == ConstId) {
      uVar9 = getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      bVar5 = false;
      IVar11 = 0x20;
      if (uVar9 == 0x20) goto LAB_00800b03;
LAB_00800a99:
      IVar11 = getEffectiveShifts(pEVar10);
      IVar7 = uVar9 - IVar11;
      if (uVar9 < IVar11) {
        IVar7 = 0;
      }
      if (uVar9 < IVar11 || uVar9 - IVar11 == 0) {
        IVar7 = 0;
      }
      goto LAB_00800aaf;
    }
    break;
  case LoadId:
    pEVar10 = *(Expression **)(curr + 2);
    bVar5 = false;
    IVar11 = 0x20;
    if (pEVar10->_id == ConstId) {
LAB_008008a2:
      bVar5 = false;
      IVar7 = getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      IVar8 = getEffectiveShifts(pEVar10);
      IVar11 = IVar7 - IVar8;
      if (IVar7 < IVar8) {
        IVar11 = 0;
      }
      if (IVar7 < IVar8 || IVar7 - IVar8 == 0) {
        IVar11 = 0;
      }
    }
    goto LAB_00800b03;
  case UnaryId:
  case BinaryId:
  case SelectId:
  case DropId:
  case ReturnId:
  case MemorySizeId:
  case MemoryGrowId:
  case NopId:
  case UnreachableId:
  case AtomicRMWId:
  case PopId:
  case RefNullId:
  case RefIsNullId:
  case RefFuncId:
  case RefEqId:
  case TableGetId:
  case TableSetId:
  case TableSizeId:
  case TableGrowId:
  case TryId:
  case RefTestId:
  case RefCastId:
  case BrOnId:
  case StructNewId:
  case StructGetId:
  case StructSetId:
  case ArrayFillId:
  case ArrayInitId:
  case RefAsId:
  case StringNewId:
  case StringConstId:
  case StringMeasureId:
    handle_unreachable("relationals handled before",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                       ,0x172);
  case AtomicCmpxchgId:
    IVar11 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    IVar7 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    if (IVar7 < IVar11) {
      IVar7 = IVar11;
    }
    IVar7 = IVar7 + 1;
    goto LAB_00800a68;
  case AtomicWaitId:
  case MemoryCopyId:
  case MemoryFillId:
switchD_008005c0_caseD_1a:
    IVar11 = 0x40;
    break;
  case AtomicNotifyId:
    IVar11 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    IVar7 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider);
    IVar7 = IVar7 + IVar11;
    goto LAB_00800a68;
  case AtomicFenceId:
    pEVar10 = *(Expression **)(curr + 2);
    IVar11 = 0x40;
    if ((pEVar10->_id == ConstId) &&
       (IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar7 != 0x40)) {
      if (*(long *)(pEVar10 + 2) != 3) {
LAB_00800b9e:
        __assert_fail("type == Type::i64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x121,"int64_t wasm::Literal::geti64() const");
      }
      if (-1 < *(long *)(pEVar10 + 1)) goto LAB_008009e6;
    }
    break;
  case SIMDReplaceId:
    piVar4 = *(int **)(curr + 2);
    IVar11 = 0x40;
    if ((*piVar4 == 0xe) &&
       (IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar7 != 0x40)) {
      if (*(long *)(piVar4 + 8) != 3) goto LAB_00800b9e;
      uVar9 = ceilLog2(*(uint64_t *)(piVar4 + 4));
      goto LAB_00800881;
    }
    break;
  case SIMDShuffleId:
    piVar4 = *(int **)(curr + 2);
    if (*piVar4 != 0xe) goto switchD_008005c0_caseD_1a;
    IVar11 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    if (*(long *)(piVar4 + 8) != 3) goto LAB_00800b9e;
    IVar7 = ceilLog2(*(uint64_t *)(piVar4 + 4));
LAB_0080071f:
    bVar5 = IVar7 < IVar11;
    goto LAB_00800a71;
  case SIMDLoadStoreLaneId:
    pEVar10 = *(Expression **)(curr + 2);
    if (pEVar10->_id != ConstId) goto switchD_008005c0_caseD_1a;
    IVar11 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    IVar7 = getEffectiveShifts(pEVar10);
    IVar7 = IVar7 + IVar11;
LAB_00800a68:
    bVar5 = IVar7 < 0x40;
    IVar11 = 0x40;
LAB_00800a71:
    if (bVar5) {
      IVar11 = IVar7;
    }
    break;
  case MemoryInitId:
    pEVar10 = *(Expression **)(curr + 2);
    IVar11 = 0x40;
    if (pEVar10->_id != ConstId) break;
    uVar9 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider);
    bVar5 = false;
    IVar11 = 0x40;
    if (uVar9 != 0x40) goto LAB_00800a99;
    goto LAB_00800b03;
  case DataDropId:
    pEVar10 = *(Expression **)(curr + 2);
    bVar5 = false;
    if (pEVar10->_id == ConstId) goto LAB_008008a2;
    IVar11 = 0x40;
    goto LAB_00800b03;
  default:
    goto switchD_008005c0_caseD_32;
  }
switchD_008005c0_caseD_1:
  bVar5 = false;
LAB_00800b03:
  if (bVar5) {
    uVar3 = (curr->type).id;
    if (6 < uVar3) {
LAB_00800b67:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                    ,0xc6,"BasicType wasm::Type::getBasic() const");
    }
    uVar9 = (int)uVar3 - 1;
    if (2 < uVar9) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                         ,0x1b4);
    }
    IVar11 = *(Index *)(&DAT_00b8f098 + (ulong)uVar9 * 4);
  }
  return IVar11;
}

Assistant:

Index getMaxBits(Expression* curr,
                 LocalInfoProvider* localInfoProvider = nullptr) {
  if (Properties::emitsBoolean(curr)) {
    return 1;
  }
  if (auto* c = curr->dynCast<Const>()) {
    switch (curr->type.getBasic()) {
      case Type::i32:
        return 32 - c->value.countLeadingZeroes().geti32();
      case Type::i64:
        return 64 - c->value.countLeadingZeroes().geti64();
      default:
        WASM_UNREACHABLE("invalid type");
    }
  } else if (auto* binary = curr->dynCast<Binary>()) {
    switch (binary->op) {
      // 32-bit
      case RotLInt32:
      case RotRInt32:
      case SubInt32:
        return 32;
      case AddInt32: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(32), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt32: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(32), maxBitsLeft + maxBitsRight);
      }
      case DivSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // If either side might be negative, then the result will be negative
          if (maxBitsLeft == 32 || c->value.geti32() < 0) {
            return 32;
          }
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return 32;
      }
      case DivUInt32: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return maxBitsLeft;
      }
      case RemSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 32) {
            return 32;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case RemUInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case AndInt32: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt32:
      case XorInt32: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt32: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          return std::min(Index(32),
                          getMaxBits(binary->left, localInfoProvider) +
                            Bits::getEffectiveShifts(shifts));
        }
        return 32;
      }
      case ShrUInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case ShrSInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 32) {
            return 32;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case RotLInt64:
      case RotRInt64:
      case SubInt64:
        return 64;
      case AddInt64: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(64), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt64: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(64), maxBitsLeft + maxBitsRight);
      }
      case DivSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left or right const value is negative
          if (maxBitsLeft == 64 || c->value.geti64() < 0) {
            return 64;
          }
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return 64;
      }
      case DivUInt64: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return maxBitsLeft;
      }
      case RemSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 64) {
            return 64;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case RemUInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case AndInt64: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt64:
      case XorInt64: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt64: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          return std::min(Index(64),
                          Bits::getEffectiveShifts(shifts) + maxBits);
        }
        return 64;
      }
      case ShrUInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      case ShrSInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 64) {
            return 64;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      // comparisons
      case EqInt32:
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case LeSInt32:
      case LeUInt32:
      case GtSInt32:
      case GtUInt32:
      case GeSInt32:
      case GeUInt32:

      case EqInt64:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case LeSInt64:
      case LeUInt64:
      case GtSInt64:
      case GtUInt64:
      case GeSInt64:
      case GeUInt64:

      case EqFloat32:
      case NeFloat32:
      case LtFloat32:
      case LeFloat32:
      case GtFloat32:
      case GeFloat32:

      case EqFloat64:
      case NeFloat64:
      case LtFloat64:
      case LeFloat64:
      case GtFloat64:
      case GeFloat64:
        WASM_UNREACHABLE("relationals handled before");
      default: {
      }
    }
  } else if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      case EqZInt32:
      case EqZInt64:
        WASM_UNREACHABLE("relationals handled before");
      case WrapInt64:
      case ExtendUInt32:
        return std::min(Index(32), getMaxBits(unary->value, localInfoProvider));
      case ExtendS8Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(32) : maxBits;
      }
      case ExtendS16Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(32) : maxBits;
      }
      case ExtendS8Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(64) : maxBits;
      }
      case ExtendS16Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(64) : maxBits;
      }
      case ExtendS32Int64:
      case ExtendSInt32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 32 ? Index(64) : maxBits;
      }
      default: {
      }
    }
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    // a tee passes through the value
    return getMaxBits(set->value, localInfoProvider);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    // TODO: Should this be optional?
    assert(localInfoProvider);
    return localInfoProvider->getMaxBitsForLocal(get);
  } else if (auto* load = curr->dynCast<Load>()) {
    // if signed, then the sign-extension might fill all the bits
    // if unsigned, then we have a limit
    if (LoadUtils::isSignRelevant(load) && !load->signed_) {
      return 8 * load->bytes;
    }
  }
  switch (curr->type.getBasic()) {
    case Type::i32:
      return 32;
    case Type::i64:
      return 64;
    case Type::unreachable:
      return 64; // not interesting, but don't crash
    default:
      WASM_UNREACHABLE("invalid type");
  }
}